

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O2

void Assimp::FBX::ParseVectorDataArray
               (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *out,Element *el)

{
  Token *t;
  pointer ppTVar1;
  char *end;
  size_t __n;
  Scope *sc;
  Element *pEVar2;
  Element *in_R9;
  pointer ppTVar3;
  undefined1 auVar4 [8];
  int iVar5;
  ulong __n_00;
  float fVar6;
  char type;
  vector<char,_std::allocator<char>_> buff;
  char *data;
  uint32_t count;
  byte local_69;
  undefined1 local_68 [8];
  undefined8 uStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined1 local_48 [12];
  float fStack_3c;
  char *local_38;
  uint local_2c;
  
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize(out,0);
  ppTVar3 = (el->tokens).
            super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar3 ==
      (el->tokens).
      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_68,"unexpected empty element",(allocator<char> *)local_48);
    anon_unknown.dwarf_cefc03::ParseError((string *)local_68,el);
  }
  t = *ppTVar3;
  if (t->column == 0xffffffff) {
    local_38 = t->sbegin;
    end = t->send;
    anon_unknown_20::ReadBinaryDataArrayHead(&local_38,end,(char *)&local_69,&local_2c,el);
    if ((local_2c & 3) != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_68,"number of floats is not a multiple of four (4) (binary)",
                 (allocator<char> *)local_48);
      anon_unknown.dwarf_cefc03::ParseError((string *)local_68,el);
    }
    if (local_2c != 0) {
      if ((local_69 & 0xfd) != 100) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_68,"expected float or double array (binary)",
                   (allocator<char> *)local_48);
        anon_unknown.dwarf_cefc03::ParseError((string *)local_68,el);
      }
      local_68 = (undefined1  [8])0x0;
      uStack_60 = (pointer)0x0;
      local_58._M_allocated_capacity = 0;
      anon_unknown_20::ReadBinaryDataArray
                (local_69,local_2c,&local_38,end,(vector<char,_std::allocator<char>_> *)local_68,
                 in_R9);
      __n_00 = (ulong)(local_2c >> 2);
      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::reserve(out,__n_00);
      if (local_69 == 0x66) {
        auVar4 = local_68;
        while (iVar5 = (int)__n_00, __n_00 = (ulong)(iVar5 - 1), iVar5 != 0) {
          local_48._0_8_ = *(undefined8 *)auVar4;
          unique0x100003c7 = *(double *)((long)auVar4 + 8);
          std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
          emplace_back<aiColor4t<float>>
                    ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)out,
                     (aiColor4t<float> *)local_48);
          auVar4 = (undefined1  [8])((long)auVar4 + 0x10);
        }
      }
      else if (local_69 == 100) {
        auVar4 = local_68;
        while (iVar5 = (int)__n_00, __n_00 = (ulong)(iVar5 - 1), iVar5 != 0) {
          local_48._4_4_ = (float)*(double *)((long)auVar4 + 8);
          local_48._0_4_ = (float)*(double *)auVar4;
          stack0xffffffffffffffc0 =
               (double)CONCAT44((float)*(double *)((long)auVar4 + 0x18),
                                (float)*(double *)((long)auVar4 + 0x10));
          std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
          emplace_back<aiColor4t<float>>
                    ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)out,
                     (aiColor4t<float> *)local_48);
          auVar4 = (undefined1  [8])((long)auVar4 + 0x20);
        }
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)local_68);
    }
  }
  else {
    __n = ParseTokenAsDim(t);
    std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::reserve(out,__n);
    sc = GetRequiredScope(el);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_68,"a",(allocator<char> *)local_48);
    pEVar2 = GetRequiredElement(sc,(string *)local_68,el);
    std::__cxx11::string::~string((string *)local_68);
    ppTVar3 = (pEVar2->tokens).
              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppTVar1 = (pEVar2->tokens).
              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (((int)ppTVar1 - (int)ppTVar3 & 0x18U) != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_68,"number of floats is not a multiple of four (4)",
                 (allocator<char> *)local_48);
      anon_unknown.dwarf_cefc03::ParseError((string *)local_68,el);
    }
    for (; ppTVar3 != ppTVar1; ppTVar3 = ppTVar3 + 4) {
      local_68 = (undefined1  [8])0x0;
      uStack_60 = (pointer)0x0;
      fVar6 = ParseTokenAsFloat(*ppTVar3);
      local_68._0_4_ = fVar6;
      fVar6 = ParseTokenAsFloat(ppTVar3[1]);
      local_68._4_4_ = fVar6;
      fVar6 = ParseTokenAsFloat(ppTVar3[2]);
      uStack_60 = (pointer)CONCAT44(uStack_60._4_4_,fVar6);
      fVar6 = ParseTokenAsFloat(ppTVar3[3]);
      uStack_60 = (pointer)CONCAT44(fVar6,(float)uStack_60);
      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
                (out,(value_type *)local_68);
    }
  }
  return;
}

Assistant:

void ParseVectorDataArray(std::vector<aiColor4D>& out, const Element& el)
{
    out.resize( 0 );
    const TokenList& tok = el.Tokens();
    if(tok.empty()) {
        ParseError("unexpected empty element",&el);
    }

    if(tok[0]->IsBinary()) {
        const char* data = tok[0]->begin(), *end = tok[0]->end();

        char type;
        uint32_t count;
        ReadBinaryDataArrayHead(data, end, type, count, el);

        if(count % 4 != 0) {
            ParseError("number of floats is not a multiple of four (4) (binary)",&el);
        }

        if(!count) {
            return;
        }

        if (type != 'd' && type != 'f') {
            ParseError("expected float or double array (binary)",&el);
        }

        std::vector<char> buff;
        ReadBinaryDataArray(type, count, data, end, buff, el);

        ai_assert(data == end);
        ai_assert(buff.size() == count * (type == 'd' ? 8 : 4));

        const uint32_t count4 = count / 4;
        out.reserve(count4);

        if (type == 'd') {
            const double* d = reinterpret_cast<const double*>(&buff[0]);
            for (unsigned int i = 0; i < count4; ++i, d += 4) {
                out.push_back(aiColor4D(static_cast<float>(d[0]),
                    static_cast<float>(d[1]),
                    static_cast<float>(d[2]),
                    static_cast<float>(d[3])));
            }
        }
        else if (type == 'f') {
            const float* f = reinterpret_cast<const float*>(&buff[0]);
            for (unsigned int i = 0; i < count4; ++i, f += 4) {
                out.push_back(aiColor4D(f[0],f[1],f[2],f[3]));
            }
        }
        return;
    }

    const size_t dim = ParseTokenAsDim(*tok[0]);

    //  see notes in ParseVectorDataArray() above
    out.reserve(dim);

    const Scope& scope = GetRequiredScope(el);
    const Element& a = GetRequiredElement(scope,"a",&el);

    if (a.Tokens().size() % 4 != 0) {
        ParseError("number of floats is not a multiple of four (4)",&el);
    }
    for (TokenList::const_iterator it = a.Tokens().begin(), end = a.Tokens().end(); it != end; ) {
        aiColor4D v;
        v.r = ParseTokenAsFloat(**it++);
        v.g = ParseTokenAsFloat(**it++);
        v.b = ParseTokenAsFloat(**it++);
        v.a = ParseTokenAsFloat(**it++);

        out.push_back(v);
    }
}